

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

bool __thiscall
absl::time_internal::cctz::TimeZoneInfo::EquivTransitions
          (TimeZoneInfo *this,uint_fast8_t tt1_index,uint_fast8_t tt2_index)

{
  const_reference pvVar1;
  const_reference pvVar2;
  TransitionType *tt2;
  TransitionType *tt1;
  uint_fast8_t tt2_index_local;
  uint_fast8_t tt1_index_local;
  TimeZoneInfo *this_local;
  
  if (tt1_index == tt2_index) {
    this_local._7_1_ = true;
  }
  else {
    pvVar1 = std::
             vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
             ::operator[](&this->transition_types_,(ulong)tt1_index);
    pvVar2 = std::
             vector<absl::time_internal::cctz::TransitionType,_std::allocator<absl::time_internal::cctz::TransitionType>_>
             ::operator[](&this->transition_types_,(ulong)tt2_index);
    if (pvVar1->utc_offset == pvVar2->utc_offset) {
      if ((pvVar1->is_dst & 1U) == (pvVar2->is_dst & 1U)) {
        if (pvVar1->abbr_index == pvVar2->abbr_index) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool TimeZoneInfo::EquivTransitions(std::uint_fast8_t tt1_index,
                                    std::uint_fast8_t tt2_index) const {
  if (tt1_index == tt2_index) return true;
  const TransitionType& tt1(transition_types_[tt1_index]);
  const TransitionType& tt2(transition_types_[tt2_index]);
  if (tt1.utc_offset != tt2.utc_offset) return false;
  if (tt1.is_dst != tt2.is_dst) return false;
  if (tt1.abbr_index != tt2.abbr_index) return false;
  return true;
}